

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

int exr_set_data_window(exr_context_t ctxt,int part_index,exr_attr_box2i_t *dw)

{
  pthread_mutex_t *__mutex;
  exr_priv_part_t curpart;
  exr_attr_box2i_t *peVar1;
  exr_attr_v2i_t eVar2;
  exr_result_t eVar3;
  _func_exr_result_t_exr_const_context_t_exr_result_t *UNRECOVERED_JUMPTABLE;
  exr_context_t nonc;
  
  if (dw == (exr_attr_box2i_t *)0x0) {
    eVar3 = (*ctxt->report_error)(ctxt,3,"Missing value for data window assignment");
    return eVar3;
  }
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  __mutex = &ctxt->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if ((-1 < part_index) && (part_index < ctxt->num_parts)) {
    if (ctxt->mode == '\x03') {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      UNRECOVERED_JUMPTABLE = ctxt->standard_error;
      eVar3 = 0x15;
    }
    else {
      if (ctxt->mode != '\0') {
        curpart = ctxt->parts[(uint)part_index];
        if (curpart->dataWindow == (exr_attribute_t *)0x0) {
          eVar3 = exr_attr_list_add(ctxt,&curpart->attributes,"dataWindow",EXR_ATTR_BOX2I,0,
                                    (uint8_t **)0x0,&curpart->dataWindow);
        }
        else {
          eVar3 = 0;
          if (curpart->dataWindow->type != EXR_ATTR_BOX2I) {
            pthread_mutex_unlock((pthread_mutex_t *)__mutex);
            eVar3 = (*ctxt->print_error)
                              (ctxt,6,"Invalid required attribute type \'%s\' for \'%s\'",
                               curpart->dataWindow->type_name,"dataWindow",ctxt->print_error);
            return eVar3;
          }
        }
        if (eVar3 == 0) {
          peVar1 = (curpart->dataWindow->field_6).box2i;
          eVar2 = dw->max;
          peVar1->min = dw->min;
          peVar1->max = eVar2;
          eVar2 = dw->max;
          (curpart->data_window).min = dw->min;
          (curpart->data_window).max = eVar2;
          eVar3 = internal_exr_compute_tile_information(ctxt,curpart,1);
        }
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return eVar3;
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      UNRECOVERED_JUMPTABLE = ctxt->standard_error;
      eVar3 = 8;
    }
    eVar3 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar3);
    return eVar3;
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  eVar3 = (*ctxt->print_error)
                    (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,ctxt->print_error
                    );
  return eVar3;
}

Assistant:

exr_result_t
exr_set_data_window (
    exr_context_t ctxt, int part_index, const exr_attr_box2i_t* dw)
{
    if (!dw)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Missing value for data window assignment");

    {
        REQ_ATTR_FIND_CREATE (dataWindow, EXR_ATTR_BOX2I);

        if (rv == EXR_ERR_SUCCESS)
        {
            *(attr->box2i)    = *dw;
            part->data_window = *dw;

            rv = internal_exr_compute_tile_information (ctxt, part, 1);
        }

        return EXR_UNLOCK_AND_RETURN (rv);
    }
}